

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall UdpLayer::openSocket(UdpLayer *this)

{
  ulong uVar1;
  int iVar2;
  bdStackMutex local_30;
  bdStackMutex stack;
  sockaddr_in tmpaddr;
  UdpLayer *this_local;
  
  bdMutex::lock(&this->sockMtx);
  iVar2 = bdnet_socket(2,2,0);
  this->sockfd = iVar2;
  uVar1._0_2_ = (this->laddr).sin_family;
  uVar1._2_2_ = (this->laddr).sin_port;
  uVar1._4_4_ = (this->laddr).sin_addr;
  stack.mMtx = (bdMutex *)(uVar1 & 0xffffffff);
  iVar2 = bdnet_bind(this->sockfd,(sockaddr *)&stack,0x10);
  if (iVar2 == 0) {
    bdnet_fcntl(this->sockfd,4,0x800);
    this->errorState = 0;
    bdMutex::unlock(&this->sockMtx);
    setTTL(this,0x40);
    clearDataTransferred(this);
    bdStackMutex::bdStackMutex(&local_30,&this->sockMtx);
    this->stopThread = false;
    bdStackMutex::~bdStackMutex(&local_30);
    (*(this->super_bdThread)._vptr_bdThread[2])();
    this_local._4_4_ = 1;
  }
  else {
    this->errorState = 0x62;
    bdMutex::unlock(&this->sockMtx);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int UdpLayer::openSocket() {
	sockMtx.lock();   /********** LOCK MUTEX *********/

	/* make a socket */
    sockfd = bdnet_socket(PF_INET, SOCK_DGRAM, 0);
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UpdStreamer::openSocket()" << std::endl;
#endif
	/* bind to address */


#ifdef UDP_LOOPBACK_TESTING
        bdnet_inet_aton("127.0.0.1", &(laddr.sin_addr));
#endif

#ifdef OPEN_UNIVERSAL_PORT
    struct sockaddr_in tmpaddr = laddr;
    tmpaddr.sin_addr.s_addr = 0;
	if (0 != bdnet_bind(sockfd, (struct sockaddr *) (&tmpaddr), sizeof(tmpaddr)))
#else
	if (0 != bdnet_bind(sockfd, (struct sockaddr *) (&laddr), sizeof(laddr)))
#endif
	{
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Socket Failed to Bind to : " << laddr << std::endl;
		std::cerr << "Error: " << bdnet_errno() << std::endl;
#endif
		errorState = EADDRINUSE;
		//exit(1);

		sockMtx.unlock(); /******** UNLOCK MUTEX *********/
		return -1;
	}

	if (-1 == bdnet_fcntl(sockfd, F_SETFL, O_NONBLOCK)) {
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Failed to Make Non-Blocking" << std::endl;
#endif
	}

#ifdef UDP_ENABLE_BROADCAST
	/* Setup socket for broadcast. */
	int val = 1;
	if (-1 == setsockopt(sockfd, SOL_SOCKET, SO_BROADCAST, &val, sizeof(int))) {
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Failed to Make Socket Broadcast" << std::endl;
#endif
	}
#endif

	errorState = 0;

#ifdef DEBUG_UDP_LAYER
	std::cerr << "Socket Bound to : " << laddr << std::endl;
#endif

	sockMtx.unlock(); /******** UNLOCK MUTEX *********/

#ifdef DEBUG_UDP_LAYER
	std::cerr << "Setting TTL to " << UDP_DEF_TTL << std::endl;
#endif
	setTTL(UDP_DEF_TTL);
	clearDataTransferred(); // clear statistics.

	// start up our thread.
	{
		bdStackMutex stack(sockMtx);   /********** LOCK MUTEX *********/
		stopThread = false;
	}
	start();

	return 1;
}